

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

void __thiscall
cmdline::parser::option_without_value::option_without_value
          (option_without_value *this,string *name,char short_name,string *desc)

{
  (this->super_option_base)._vptr_option_base = (_func_int **)&PTR__option_without_value_00189418;
  std::__cxx11::string::string((string *)&this->nam,(string *)name);
  this->snam = short_name;
  std::__cxx11::string::string((string *)&this->desc,(string *)desc);
  this->has = false;
  return;
}

Assistant:

option_without_value(const std::string& name, char short_name, const std::string& desc)
            : nam(name), snam(short_name), desc(desc), has(false) {}